

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O1

void aom_highbd_comp_mask_pred_sse2
               (uint8_t *comp_pred8,uint8_t *pred8,int width,int height,uint8_t *ref8,int ref_stride
               ,uint8_t *mask,int mask_stride,int invert_mask)

{
  undefined2 *puVar1;
  undefined2 *puVar2;
  ulong uVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  unkuint9 Var29;
  undefined1 auVar30 [11];
  undefined1 auVar31 [15];
  undefined1 auVar32 [11];
  undefined1 auVar33 [15];
  undefined1 auVar34 [11];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 (*pauVar41) [16];
  int iVar42;
  int iVar43;
  undefined1 (*pauVar44) [16];
  undefined1 (*pauVar45) [16];
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  uint8_t *puVar50;
  long lVar51;
  undefined1 (*pauVar52) [16];
  undefined1 (*pauVar53) [16];
  ushort uVar54;
  ushort uVar60;
  byte bVar61;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 uVar75;
  short sVar74;
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar115 [16];
  unkint10 Var55;
  undefined1 auVar65 [16];
  undefined1 auVar71 [16];
  undefined1 auVar66 [16];
  undefined1 auVar72 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar91 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar92 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar93 [16];
  undefined1 auVar98 [16];
  undefined1 auVar106 [16];
  undefined1 auVar101 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar109 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar116 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar114 [16];
  undefined1 auVar118 [16];
  
  pauVar44 = (undefined1 (*) [16])((long)comp_pred8 * 2);
  iVar42 = ref_stride;
  iVar43 = width;
  pauVar41 = (undefined1 (*) [16])((long)pred8 * 2);
  pauVar45 = (undefined1 (*) [16])((long)ref8 * 2);
  if (invert_mask == 0) {
    iVar42 = width;
    iVar43 = ref_stride;
    pauVar41 = (undefined1 (*) [16])((long)ref8 * 2);
    pauVar45 = (undefined1 (*) [16])((long)pred8 * 2);
  }
  lVar47 = (long)iVar43;
  lVar46 = (long)iVar42;
  lVar48 = (long)mask_stride;
  if (width == 8) {
    iVar43 = 1;
    if (1 < height) {
      iVar43 = height;
    }
    do {
      auVar95 = *pauVar41;
      uVar3 = *(ulong *)mask;
      uVar75 = (undefined1)(uVar3 >> 0x38);
      auVar5._8_6_ = 0;
      auVar5._0_8_ = uVar3;
      auVar5[0xe] = uVar75;
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar3;
      auVar8[0xc] = (char)(uVar3 >> 0x30);
      auVar8._13_2_ = auVar5._13_2_;
      auVar11._8_4_ = 0;
      auVar11._0_8_ = uVar3;
      auVar11._12_3_ = auVar8._12_3_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = uVar3;
      auVar14[10] = (char)(uVar3 >> 0x28);
      auVar14._11_4_ = auVar11._11_4_;
      auVar17._8_2_ = 0;
      auVar17._0_8_ = uVar3;
      auVar17._10_5_ = auVar14._10_5_;
      auVar20[8] = (char)(uVar3 >> 0x20);
      auVar20._0_8_ = uVar3;
      auVar20._9_6_ = auVar17._9_6_;
      auVar31._7_8_ = 0;
      auVar31._0_7_ = auVar20._8_7_;
      Var29 = CONCAT81(SUB158(auVar31 << 0x40,7),(char)(uVar3 >> 0x18));
      auVar37._9_6_ = 0;
      auVar37._0_9_ = Var29;
      auVar32._1_10_ = SUB1510(auVar37 << 0x30,5);
      auVar32[0] = (char)(uVar3 >> 0x10);
      auVar38._11_4_ = 0;
      auVar38._0_11_ = auVar32;
      uVar54 = (ushort)uVar3;
      auVar23[2] = (char)(uVar3 >> 8);
      auVar23._0_2_ = uVar54;
      auVar23._3_12_ = SUB1512(auVar38 << 0x20,3);
      auVar26._2_13_ = auVar23._2_13_;
      auVar26._0_2_ = uVar54 & 0xff;
      sVar74 = (short)Var29;
      auVar79._0_12_ = auVar95._0_12_;
      auVar79._12_2_ = auVar95._6_2_;
      auVar79._14_2_ = *(undefined2 *)(*pauVar45 + 6);
      auVar78._12_4_ = auVar79._12_4_;
      auVar78._0_10_ = auVar95._0_10_;
      auVar78._10_2_ = *(undefined2 *)(*pauVar45 + 4);
      auVar77._10_6_ = auVar78._10_6_;
      auVar77._0_8_ = auVar95._0_8_;
      auVar77._8_2_ = auVar95._4_2_;
      auVar67._8_8_ = auVar77._8_8_;
      auVar67._6_2_ = *(undefined2 *)(*pauVar45 + 2);
      auVar67._4_2_ = auVar95._2_2_;
      auVar67._0_2_ = auVar95._0_2_;
      auVar67._2_2_ = *(undefined2 *)*pauVar45;
      auVar87._0_12_ = auVar26._0_12_;
      auVar87._12_2_ = sVar74;
      auVar87._14_2_ = 0x40 - sVar74;
      auVar86._12_4_ = auVar87._12_4_;
      auVar86._0_10_ = auVar26._0_10_;
      auVar86._10_2_ = 0x40 - auVar32._0_2_;
      auVar85._10_6_ = auVar86._10_6_;
      auVar85._8_2_ = auVar32._0_2_;
      auVar85._6_2_ = 0x40 - auVar23._2_2_;
      auVar85._4_2_ = auVar23._2_2_;
      auVar85._0_4_ = CONCAT22(0x40 - (uVar54 & 0xff),uVar54) & 0xffff00ff;
      auVar88 = pmaddwd(auVar85,auVar67);
      auVar89._0_4_ = auVar88._0_4_ + 0x20 >> 6;
      auVar89._4_4_ = auVar88._4_4_ + 0x20 >> 6;
      auVar89._8_4_ = auVar88._8_4_ + 0x20 >> 6;
      auVar89._12_4_ = auVar88._12_4_ + 0x20 >> 6;
      auVar88._2_2_ = *(undefined2 *)(*pauVar45 + 8);
      auVar88._0_2_ = auVar95._8_2_;
      auVar88._4_2_ = auVar95._10_2_;
      auVar88._6_2_ = *(undefined2 *)(*pauVar45 + 10);
      auVar88._8_2_ = auVar95._12_2_;
      auVar88._10_2_ = *(undefined2 *)(*pauVar45 + 0xc);
      auVar88._12_2_ = auVar95._14_2_;
      auVar88._14_2_ = *(undefined2 *)(*pauVar45 + 0xe);
      auVar95._2_2_ = 0x40 - auVar20._8_2_;
      auVar95._0_2_ = auVar20._8_2_;
      auVar95._4_2_ = auVar14._10_2_;
      auVar95._6_2_ = 0x40 - auVar14._10_2_;
      auVar95._8_2_ = auVar8._12_2_;
      auVar95._10_2_ = 0x40 - auVar8._12_2_;
      auVar95[0xc] = uVar75;
      auVar95[0xd] = 0;
      auVar95._14_2_ = 0x40 - (auVar5._13_2_ >> 8);
      auVar95 = pmaddwd(auVar95,auVar88);
      auVar69._0_4_ = auVar95._0_4_ + 0x20 >> 6;
      auVar69._4_4_ = auVar95._4_4_ + 0x20 >> 6;
      auVar69._8_4_ = auVar95._8_4_ + 0x20 >> 6;
      auVar69._12_4_ = auVar95._12_4_ + 0x20 >> 6;
      auVar95 = packssdw(auVar89,auVar69);
      *pauVar44 = auVar95;
      mask = (uint8_t *)((long)mask + lVar48);
      pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar46 * 2);
      pauVar41 = (undefined1 (*) [16])(*pauVar41 + lVar47 * 2);
      pauVar44 = pauVar44 + 1;
      iVar43 = iVar43 + -1;
    } while (iVar43 != 0);
  }
  else if (width == 0x10) {
    iVar43 = 1;
    if (1 < height) {
      iVar43 = height;
    }
    pauVar45 = pauVar45 + 1;
    pauVar41 = pauVar41 + 1;
    pauVar44 = pauVar44 + 1;
    do {
      auVar95 = pauVar41[-1];
      auVar88 = *pauVar41;
      auVar69 = *(undefined1 (*) [16])mask;
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar69._0_13_;
      auVar4[0xe] = auVar69[7];
      auVar7[0xc] = auVar69[6];
      auVar7._0_12_ = auVar69._0_12_;
      auVar7._13_2_ = auVar4._13_2_;
      auVar10[0xb] = 0;
      auVar10._0_11_ = auVar69._0_11_;
      auVar10._12_3_ = auVar7._12_3_;
      auVar13[10] = auVar69[5];
      auVar13._0_10_ = auVar69._0_10_;
      auVar13._11_4_ = auVar10._11_4_;
      auVar16[9] = 0;
      auVar16._0_9_ = auVar69._0_9_;
      auVar16._10_5_ = auVar13._10_5_;
      auVar19[8] = auVar69[4];
      auVar19._0_8_ = auVar69._0_8_;
      auVar19._9_6_ = auVar16._9_6_;
      auVar28._7_8_ = 0;
      auVar28._0_7_ = auVar19._8_7_;
      Var29 = CONCAT81(SUB158(auVar28 << 0x40,7),auVar69[3]);
      auVar35._9_6_ = 0;
      auVar35._0_9_ = Var29;
      auVar30._1_10_ = SUB1510(auVar35 << 0x30,5);
      auVar30[0] = auVar69[2];
      auVar36._11_4_ = 0;
      auVar36._0_11_ = auVar30;
      uVar60 = auVar69._0_2_;
      auVar22[2] = auVar69[1];
      auVar22._0_2_ = uVar60;
      auVar22._3_12_ = SUB1512(auVar36 << 0x20,3);
      auVar25._2_13_ = auVar22._2_13_;
      auVar25._0_2_ = uVar60 & 0xff;
      uVar54 = CONCAT11(0,auVar69[8]);
      Var55 = (unkuint10)auVar69[0xc] << 0x40;
      bVar61 = auVar69[0xd];
      auVar101[10] = bVar61;
      auVar101._0_10_ = Var55;
      auVar101[0xb] = 0;
      sVar74 = (short)Var29;
      auVar114._0_12_ = auVar95._0_12_;
      auVar114._12_2_ = auVar95._6_2_;
      auVar114._14_2_ = *(undefined2 *)(pauVar45[-1] + 6);
      auVar113._12_4_ = auVar114._12_4_;
      auVar113._0_10_ = auVar95._0_10_;
      auVar113._10_2_ = *(undefined2 *)(pauVar45[-1] + 4);
      auVar112._10_6_ = auVar113._10_6_;
      auVar112._0_8_ = auVar95._0_8_;
      auVar112._8_2_ = auVar95._4_2_;
      auVar111._8_8_ = auVar112._8_8_;
      auVar111._6_2_ = *(undefined2 *)(pauVar45[-1] + 2);
      auVar111._4_2_ = auVar95._2_2_;
      auVar111._0_2_ = auVar95._0_2_;
      auVar111._2_2_ = *(undefined2 *)pauVar45[-1];
      auVar66._0_12_ = auVar25._0_12_;
      auVar66._12_2_ = sVar74;
      auVar66._14_2_ = 0x40 - sVar74;
      auVar65._12_4_ = auVar66._12_4_;
      auVar65._0_10_ = auVar25._0_10_;
      auVar65._10_2_ = 0x40 - auVar30._0_2_;
      auVar64._10_6_ = auVar65._10_6_;
      auVar64._8_2_ = auVar30._0_2_;
      auVar64._6_2_ = 0x40 - auVar22._2_2_;
      auVar64._4_2_ = auVar22._2_2_;
      auVar64._0_4_ = CONCAT22(0x40 - (uVar60 & 0xff),uVar60) & 0xffff00ff;
      auVar67 = pmaddwd(auVar64,auVar111);
      auVar68._0_4_ = auVar67._0_4_ + 0x20 >> 6;
      auVar68._4_4_ = auVar67._4_4_ + 0x20 >> 6;
      auVar68._8_4_ = auVar67._8_4_ + 0x20 >> 6;
      auVar68._12_4_ = auVar67._12_4_ + 0x20 >> 6;
      auVar76._2_2_ = *(undefined2 *)(pauVar45[-1] + 8);
      auVar76._0_2_ = auVar95._8_2_;
      auVar76._4_2_ = auVar95._10_2_;
      auVar76._6_2_ = *(undefined2 *)(pauVar45[-1] + 10);
      auVar76._8_2_ = auVar95._12_2_;
      auVar76._10_2_ = *(undefined2 *)(pauVar45[-1] + 0xc);
      auVar76._12_2_ = auVar95._14_2_;
      auVar76._14_2_ = *(undefined2 *)(pauVar45[-1] + 0xe);
      auVar94._2_2_ = 0x40 - auVar19._8_2_;
      auVar94._0_2_ = auVar19._8_2_;
      auVar94._4_2_ = auVar13._10_2_;
      auVar94._6_2_ = 0x40 - auVar13._10_2_;
      auVar94._8_2_ = auVar7._12_2_;
      auVar94._10_2_ = 0x40 - auVar7._12_2_;
      auVar94[0xc] = auVar69[7];
      auVar94[0xd] = 0;
      auVar94._14_2_ = 0x40 - (auVar4._13_2_ >> 8);
      auVar95 = pmaddwd(auVar94,auVar76);
      auVar96._0_4_ = auVar95._0_4_ + 0x20 >> 6;
      auVar96._4_4_ = auVar95._4_4_ + 0x20 >> 6;
      auVar96._8_4_ = auVar95._8_4_ + 0x20 >> 6;
      auVar96._12_4_ = auVar95._12_4_ + 0x20 >> 6;
      auVar67 = packssdw(auVar68,auVar96);
      uVar60 = CONCAT11(0,auVar69[0xc]);
      auVar84._0_12_ = auVar88._0_12_;
      auVar84._12_2_ = auVar88._6_2_;
      auVar84._14_2_ = *(undefined2 *)(*pauVar45 + 6);
      auVar83._12_4_ = auVar84._12_4_;
      auVar83._0_10_ = auVar88._0_10_;
      auVar83._10_2_ = *(undefined2 *)(*pauVar45 + 4);
      auVar82._10_6_ = auVar83._10_6_;
      auVar82._0_8_ = auVar88._0_8_;
      auVar82._8_2_ = auVar88._4_2_;
      auVar81._8_8_ = auVar82._8_8_;
      auVar81._6_2_ = *(undefined2 *)(*pauVar45 + 2);
      auVar81._4_2_ = auVar88._2_2_;
      auVar81._0_2_ = auVar88._0_2_;
      auVar81._2_2_ = *(undefined2 *)*pauVar45;
      auVar101[0xc] = auVar69[0xb];
      auVar101[0xd] = 0;
      auVar101._14_2_ = 0x40 - (ushort)auVar69[0xb];
      auVar100._12_4_ = auVar101._12_4_;
      auVar100._10_2_ = 0x40 - (ushort)auVar69[10];
      auVar100._0_10_ = Var55;
      auVar99._10_6_ = auVar100._10_6_;
      auVar99._0_10_ = (unkuint10)auVar69[10] << 0x40;
      auVar98._8_8_ = auVar99._8_8_;
      auVar98._6_2_ = 0x40 - (ushort)auVar69[9];
      auVar98._0_6_ = (uint6)auVar69[9] << 0x20;
      auVar97._4_12_ = auVar98._4_12_;
      auVar97._2_2_ = 0x40 - uVar54;
      auVar97._0_2_ = uVar54;
      auVar95 = pmaddwd(auVar97,auVar81);
      auVar102._0_4_ = auVar95._0_4_ + 0x20 >> 6;
      auVar102._4_4_ = auVar95._4_4_ + 0x20 >> 6;
      auVar102._8_4_ = auVar95._8_4_ + 0x20 >> 6;
      auVar102._12_4_ = auVar95._12_4_ + 0x20 >> 6;
      auVar62._2_2_ = *(undefined2 *)(*pauVar45 + 8);
      auVar62._0_2_ = auVar88._8_2_;
      auVar62._4_2_ = auVar88._10_2_;
      auVar62._6_2_ = *(undefined2 *)(*pauVar45 + 10);
      auVar62._8_2_ = auVar88._12_2_;
      auVar62._10_2_ = *(undefined2 *)(*pauVar45 + 0xc);
      auVar62._12_2_ = auVar88._14_2_;
      auVar62._14_2_ = *(undefined2 *)(*pauVar45 + 0xe);
      auVar56._2_2_ = 0x40 - uVar60;
      auVar56._0_2_ = uVar60;
      auVar56[4] = bVar61;
      auVar56[5] = 0;
      auVar56._6_2_ = 0x40 - (ushort)bVar61;
      auVar56[8] = auVar69[0xe];
      auVar56[9] = 0;
      auVar56._10_2_ = 0x40 - (ushort)auVar69[0xe];
      auVar56[0xc] = auVar69[0xf];
      auVar56[0xd] = 0;
      auVar56._14_2_ = 0x40 - (ushort)auVar69[0xf];
      auVar95 = pmaddwd(auVar56,auVar62);
      auVar57._0_4_ = auVar95._0_4_ + 0x20 >> 6;
      auVar57._4_4_ = auVar95._4_4_ + 0x20 >> 6;
      auVar57._8_4_ = auVar95._8_4_ + 0x20 >> 6;
      auVar57._12_4_ = auVar95._12_4_ + 0x20 >> 6;
      auVar95 = packssdw(auVar102,auVar57);
      pauVar44[-1] = auVar67;
      *pauVar44 = auVar95;
      mask = *(undefined1 (*) [16])mask + lVar48;
      pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar46 * 2);
      pauVar41 = (undefined1 (*) [16])(*pauVar41 + lVar47 * 2);
      pauVar44 = pauVar44 + 2;
      iVar43 = iVar43 + -1;
    } while (iVar43 != 0);
  }
  else {
    iVar43 = 1;
    if (1 < height) {
      iVar43 = height;
    }
    pauVar45 = pauVar45 + 1;
    pauVar41 = pauVar41 + 1;
    iVar42 = 0;
    do {
      if (0 < width) {
        lVar51 = 0;
        puVar50 = mask;
        pauVar52 = pauVar41;
        pauVar53 = pauVar45;
        do {
          lVar49 = 0;
          do {
            auVar95 = *(undefined1 (*) [16])(pauVar52[-1] + lVar49 * 2);
            auVar88 = *(undefined1 (*) [16])(*pauVar52 + lVar49 * 2);
            puVar2 = (undefined2 *)(pauVar53[-1] + lVar49 * 2);
            puVar1 = (undefined2 *)(*pauVar53 + lVar49 * 2);
            auVar69 = *(undefined1 (*) [16])(puVar50 + lVar49);
            auVar6[0xd] = 0;
            auVar6._0_13_ = auVar69._0_13_;
            auVar6[0xe] = auVar69[7];
            auVar9[0xc] = auVar69[6];
            auVar9._0_12_ = auVar69._0_12_;
            auVar9._13_2_ = auVar6._13_2_;
            auVar12[0xb] = 0;
            auVar12._0_11_ = auVar69._0_11_;
            auVar12._12_3_ = auVar9._12_3_;
            auVar15[10] = auVar69[5];
            auVar15._0_10_ = auVar69._0_10_;
            auVar15._11_4_ = auVar12._11_4_;
            auVar18[9] = 0;
            auVar18._0_9_ = auVar69._0_9_;
            auVar18._10_5_ = auVar15._10_5_;
            auVar21[8] = auVar69[4];
            auVar21._0_8_ = auVar69._0_8_;
            auVar21._9_6_ = auVar18._9_6_;
            auVar33._7_8_ = 0;
            auVar33._0_7_ = auVar21._8_7_;
            Var29 = CONCAT81(SUB158(auVar33 << 0x40,7),auVar69[3]);
            auVar39._9_6_ = 0;
            auVar39._0_9_ = Var29;
            auVar34._1_10_ = SUB1510(auVar39 << 0x30,5);
            auVar34[0] = auVar69[2];
            auVar40._11_4_ = 0;
            auVar40._0_11_ = auVar34;
            uVar60 = auVar69._0_2_;
            auVar24[2] = auVar69[1];
            auVar24._0_2_ = uVar60;
            auVar24._3_12_ = SUB1512(auVar40 << 0x20,3);
            auVar27._2_13_ = auVar24._2_13_;
            auVar27._0_2_ = uVar60 & 0xff;
            uVar54 = CONCAT11(0,auVar69[8]);
            Var55 = (unkuint10)auVar69[0xc] << 0x40;
            bVar61 = auVar69[0xd];
            auVar109[10] = bVar61;
            auVar109._0_10_ = Var55;
            auVar109[0xb] = 0;
            sVar74 = (short)Var29;
            auVar118._0_12_ = auVar95._0_12_;
            auVar118._12_2_ = auVar95._6_2_;
            auVar118._14_2_ = puVar2[3];
            auVar117._12_4_ = auVar118._12_4_;
            auVar117._0_10_ = auVar95._0_10_;
            auVar117._10_2_ = puVar2[2];
            auVar116._10_6_ = auVar117._10_6_;
            auVar116._0_8_ = auVar95._0_8_;
            auVar116._8_2_ = auVar95._4_2_;
            auVar115._8_8_ = auVar116._8_8_;
            auVar115._6_2_ = puVar2[1];
            auVar115._4_2_ = auVar95._2_2_;
            auVar115._0_2_ = auVar95._0_2_;
            auVar115._2_2_ = *puVar2;
            auVar72._0_12_ = auVar27._0_12_;
            auVar72._12_2_ = sVar74;
            auVar72._14_2_ = 0x40 - sVar74;
            auVar71._12_4_ = auVar72._12_4_;
            auVar71._0_10_ = auVar27._0_10_;
            auVar71._10_2_ = 0x40 - auVar34._0_2_;
            auVar70._10_6_ = auVar71._10_6_;
            auVar70._8_2_ = auVar34._0_2_;
            auVar70._6_2_ = 0x40 - auVar24._2_2_;
            auVar70._4_2_ = auVar24._2_2_;
            auVar70._0_4_ = CONCAT22(0x40 - (uVar60 & 0xff),uVar60) & 0xffff00ff;
            auVar67 = pmaddwd(auVar70,auVar115);
            auVar73._0_4_ = auVar67._0_4_ + 0x20 >> 6;
            auVar73._4_4_ = auVar67._4_4_ + 0x20 >> 6;
            auVar73._8_4_ = auVar67._8_4_ + 0x20 >> 6;
            auVar73._12_4_ = auVar67._12_4_ + 0x20 >> 6;
            auVar80._2_2_ = puVar2[4];
            auVar80._0_2_ = auVar95._8_2_;
            auVar80._4_2_ = auVar95._10_2_;
            auVar80._6_2_ = puVar2[5];
            auVar80._8_2_ = auVar95._12_2_;
            auVar80._10_2_ = puVar2[6];
            auVar80._12_2_ = auVar95._14_2_;
            auVar80._14_2_ = puVar2[7];
            auVar103._2_2_ = 0x40 - auVar21._8_2_;
            auVar103._0_2_ = auVar21._8_2_;
            auVar103._4_2_ = auVar15._10_2_;
            auVar103._6_2_ = 0x40 - auVar15._10_2_;
            auVar103._8_2_ = auVar9._12_2_;
            auVar103._10_2_ = 0x40 - auVar9._12_2_;
            auVar103[0xc] = auVar69[7];
            auVar103[0xd] = 0;
            auVar103._14_2_ = 0x40 - (auVar6._13_2_ >> 8);
            auVar95 = pmaddwd(auVar103,auVar80);
            auVar104._0_4_ = auVar95._0_4_ + 0x20 >> 6;
            auVar104._4_4_ = auVar95._4_4_ + 0x20 >> 6;
            auVar104._8_4_ = auVar95._8_4_ + 0x20 >> 6;
            auVar104._12_4_ = auVar95._12_4_ + 0x20 >> 6;
            auVar67 = packssdw(auVar73,auVar104);
            uVar60 = CONCAT11(0,auVar69[0xc]);
            auVar93._0_12_ = auVar88._0_12_;
            auVar93._12_2_ = auVar88._6_2_;
            auVar93._14_2_ = puVar1[3];
            auVar92._12_4_ = auVar93._12_4_;
            auVar92._0_10_ = auVar88._0_10_;
            auVar92._10_2_ = puVar1[2];
            auVar91._10_6_ = auVar92._10_6_;
            auVar91._0_8_ = auVar88._0_8_;
            auVar91._8_2_ = auVar88._4_2_;
            auVar90._8_8_ = auVar91._8_8_;
            auVar90._6_2_ = puVar1[1];
            auVar90._4_2_ = auVar88._2_2_;
            auVar90._0_2_ = auVar88._0_2_;
            auVar90._2_2_ = *puVar1;
            auVar109[0xc] = auVar69[0xb];
            auVar109[0xd] = 0;
            auVar109._14_2_ = 0x40 - (ushort)auVar69[0xb];
            auVar108._12_4_ = auVar109._12_4_;
            auVar108._10_2_ = 0x40 - (ushort)auVar69[10];
            auVar108._0_10_ = Var55;
            auVar107._10_6_ = auVar108._10_6_;
            auVar107._0_10_ = (unkuint10)auVar69[10] << 0x40;
            auVar106._8_8_ = auVar107._8_8_;
            auVar106._6_2_ = 0x40 - (ushort)auVar69[9];
            auVar106._0_6_ = (uint6)auVar69[9] << 0x20;
            auVar105._4_12_ = auVar106._4_12_;
            auVar105._2_2_ = 0x40 - uVar54;
            auVar105._0_2_ = uVar54;
            auVar95 = pmaddwd(auVar105,auVar90);
            auVar110._0_4_ = auVar95._0_4_ + 0x20 >> 6;
            auVar110._4_4_ = auVar95._4_4_ + 0x20 >> 6;
            auVar110._8_4_ = auVar95._8_4_ + 0x20 >> 6;
            auVar110._12_4_ = auVar95._12_4_ + 0x20 >> 6;
            auVar63._2_2_ = puVar1[4];
            auVar63._0_2_ = auVar88._8_2_;
            auVar63._4_2_ = auVar88._10_2_;
            auVar63._6_2_ = puVar1[5];
            auVar63._8_2_ = auVar88._12_2_;
            auVar63._10_2_ = puVar1[6];
            auVar63._12_2_ = auVar88._14_2_;
            auVar63._14_2_ = puVar1[7];
            auVar58._2_2_ = 0x40 - uVar60;
            auVar58._0_2_ = uVar60;
            auVar58[4] = bVar61;
            auVar58[5] = 0;
            auVar58._6_2_ = 0x40 - (ushort)bVar61;
            auVar58[8] = auVar69[0xe];
            auVar58[9] = 0;
            auVar58._10_2_ = 0x40 - (ushort)auVar69[0xe];
            auVar58[0xc] = auVar69[0xf];
            auVar58[0xd] = 0;
            auVar58._14_2_ = 0x40 - (ushort)auVar69[0xf];
            auVar95 = pmaddwd(auVar58,auVar63);
            auVar59._0_4_ = auVar95._0_4_ + 0x20 >> 6;
            auVar59._4_4_ = auVar95._4_4_ + 0x20 >> 6;
            auVar59._8_4_ = auVar95._8_4_ + 0x20 >> 6;
            auVar59._12_4_ = auVar95._12_4_ + 0x20 >> 6;
            auVar95 = packssdw(auVar110,auVar59);
            *(undefined1 (*) [16])(*pauVar44 + lVar49 * 2) = auVar67;
            *(undefined1 (*) [16])(pauVar44[1] + lVar49 * 2) = auVar95;
            lVar49 = lVar49 + 0x10;
          } while (lVar49 == 0x10);
          pauVar44 = pauVar44 + 4;
          lVar51 = lVar51 + 0x20;
          puVar50 = puVar50 + 0x20;
          pauVar53 = pauVar53 + 4;
          pauVar52 = pauVar52 + 4;
        } while (lVar51 < width);
      }
      mask = mask + lVar48;
      iVar42 = iVar42 + 1;
      pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar46 * 2);
      pauVar41 = (undefined1 (*) [16])(*pauVar41 + lVar47 * 2);
    } while (iVar42 != iVar43);
  }
  return;
}

Assistant:

void aom_highbd_comp_mask_pred_sse2(uint8_t *comp_pred8, const uint8_t *pred8,
                                    int width, int height, const uint8_t *ref8,
                                    int ref_stride, const uint8_t *mask,
                                    int mask_stride, int invert_mask) {
  int i = 0;
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  const uint16_t *src0 = invert_mask ? pred : ref;
  const uint16_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  const __m128i zero = _mm_setzero_si128();

  if (width == 8) {
    do {
      const __m128i s0 = _mm_loadu_si128((const __m128i *)(src0));
      const __m128i s1 = _mm_loadu_si128((const __m128i *)(src1));
      const __m128i m_8 = _mm_loadl_epi64((const __m128i *)mask);
      const __m128i m_16 = _mm_unpacklo_epi8(m_8, zero);

      const __m128i comp = highbd_comp_mask_pred_line_sse2(s0, s1, m_16);

      _mm_storeu_si128((__m128i *)comp_pred, comp);

      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      comp_pred += width;
      i += 1;
    } while (i < height);
  } else if (width == 16) {
    do {
      const __m128i s0 = _mm_loadu_si128((const __m128i *)(src0));
      const __m128i s2 = _mm_loadu_si128((const __m128i *)(src0 + 8));
      const __m128i s1 = _mm_loadu_si128((const __m128i *)(src1));
      const __m128i s3 = _mm_loadu_si128((const __m128i *)(src1 + 8));

      const __m128i m_8 = _mm_loadu_si128((const __m128i *)mask);
      const __m128i m01_16 = _mm_unpacklo_epi8(m_8, zero);
      const __m128i m23_16 = _mm_unpackhi_epi8(m_8, zero);

      const __m128i comp = highbd_comp_mask_pred_line_sse2(s0, s1, m01_16);
      const __m128i comp1 = highbd_comp_mask_pred_line_sse2(s2, s3, m23_16);

      _mm_storeu_si128((__m128i *)comp_pred, comp);
      _mm_storeu_si128((__m128i *)(comp_pred + 8), comp1);

      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      comp_pred += width;
      i += 1;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        for (int j = 0; j < 2; j++) {
          const __m128i s0 =
              _mm_loadu_si128((const __m128i *)(src0 + x + j * 16));
          const __m128i s2 =
              _mm_loadu_si128((const __m128i *)(src0 + x + 8 + j * 16));
          const __m128i s1 =
              _mm_loadu_si128((const __m128i *)(src1 + x + j * 16));
          const __m128i s3 =
              _mm_loadu_si128((const __m128i *)(src1 + x + 8 + j * 16));

          const __m128i m_8 =
              _mm_loadu_si128((const __m128i *)(mask + x + j * 16));
          const __m128i m01_16 = _mm_unpacklo_epi8(m_8, zero);
          const __m128i m23_16 = _mm_unpackhi_epi8(m_8, zero);

          const __m128i comp = highbd_comp_mask_pred_line_sse2(s0, s1, m01_16);
          const __m128i comp1 = highbd_comp_mask_pred_line_sse2(s2, s3, m23_16);

          _mm_storeu_si128((__m128i *)(comp_pred + j * 16), comp);
          _mm_storeu_si128((__m128i *)(comp_pred + 8 + j * 16), comp1);
        }
        comp_pred += 32;
      }
      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      i += 1;
    } while (i < height);
  }
}